

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::BlockImpl_dense<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false,_true>::
BlockImpl_dense(BlockImpl_dense<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false,_true> *this,
               Matrix<float,__1,__1,_0,__1,__1> *xpr,Index startRow,Index startCol,Index blockRows,
               Index blockCols)

{
  MapBase<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_0>::MapBase
            ((MapBase<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,__1,_false>,_0> *)
             this,(xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.
                  m_data + startRow +
                           (xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).
                           m_storage.m_rows * startCol,blockRows,blockCols);
  this->m_xpr = xpr;
  (this->m_startRow).m_value = startRow;
  (this->m_startCol).m_value = startCol;
  this->m_outerStride =
       (xpr->super_PlainObjectBase<Eigen::Matrix<float,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol), blockRows, blockCols),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }